

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::BNE_RL(CPU *this)

{
  uint8_t uVar1;
  short sVar2;
  uint8_t offset;
  CPU *this_local;
  
  this->cycles = 2;
  uVar1 = GetByte(this);
  if (((this->field_6).ps >> 1 & 1) == 0) {
    sVar2 = (short)(char)uVar1;
  }
  else {
    sVar2 = 0;
  }
  this->pc = this->pc + sVar2;
  return;
}

Assistant:

void CPU::BNE_RL()
{
    cycles = 2;
    uint8_t offset = GetByte();
    pc += (!Z) ? static_cast<int8_t>(offset) : 0;
}